

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum.c
# Opt level: O3

void Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64
               (uint32_t len,uint64_t *n,uint64_t mu,uint64_t *r2,uint64_t *a,uint32_t bBits,
               uint64_t *b,uint64_t *res)

{
  size_t sVar1;
  long lVar2;
  int iVar3;
  size_t __n;
  uint64_t uVar4;
  uint64_t *puVar5;
  byte bVar6;
  sbyte sVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint64_t *os_15;
  uint64_t *puVar12;
  uint32_t uVar13;
  ulong uVar14;
  uint64_t *puVar15;
  undefined4 in_register_0000008c;
  uint64_t *puVar16;
  uint uVar17;
  uint64_t *puVar18;
  uint64_t *puVar19;
  ulong uVar20;
  uint64_t auStack_120 [2];
  ulong local_110;
  uint64_t *local_108;
  uint64_t *local_100;
  uint64_t *local_f8;
  uint64_t *ctx_r2;
  uint64_t *local_e8;
  uint64_t *local_e0;
  uint64_t *local_d8;
  uint64_t *local_d0;
  uint64_t *local_c8;
  uint64_t *local_c0;
  uint64_t *local_b8;
  uint64_t *local_b0;
  ulong local_a8;
  uint64_t *local_a0;
  uint64_t *local_98;
  uint64_t *local_90;
  uint64_t *local_88;
  uint local_7c;
  uint64_t *local_78;
  ulong local_70;
  ulong local_68;
  uint64_t local_60;
  size_t local_58;
  uint64_t *local_50;
  uint64_t *local_48;
  uint64_t *local_40;
  uint64_t *os;
  
  local_68 = CONCAT44(in_register_0000008c,bBits);
  os = (uint64_t *)(ulong)len;
  uVar11 = (ulong)len;
  uVar20 = uVar11 * 8 + 0xf & 0xfffffffffffffff0;
  lVar2 = -uVar20;
  puVar12 = (uint64_t *)((long)auStack_120 + lVar2 + 8);
  sVar1 = uVar11 * 8;
  local_c0 = n;
  local_60 = mu;
  local_48 = r2;
  local_40 = a;
  *(undefined8 *)((long)auStack_120 + lVar2) = 0x135fee;
  memset(puVar12,0,sVar1);
  puVar5 = local_40;
  puVar15 = local_48;
  uVar4 = local_60;
  puVar18 = local_c0;
  *(undefined8 *)((long)auStack_120 + lVar2) = 0x13600c;
  Hacl_Bignum_Montgomery_bn_to_mont_u64(len,puVar18,uVar4,puVar15,puVar5,puVar12);
  puVar18 = (uint64_t *)((long)puVar12 - uVar20);
  local_a8 = uVar20;
  local_58 = sVar1;
  puVar18[-1] = 0x13602d;
  memset(puVar18,0,sVar1);
  uVar13 = (uint32_t)os;
  local_40 = puVar18;
  if ((uint)local_68 < 200) {
    puVar16 = puVar18 + -(ulong)(uVar13 * 2);
    uVar20 = 0;
    puVar16[-1] = 0x136061;
    memset(puVar16,0,(ulong)(uVar13 * 2) * 8);
    sVar1 = local_58;
    puVar15 = local_c0;
    puVar16[-1] = 0x136074;
    memcpy(puVar16,puVar15,sVar1);
    puVar15 = local_48;
    sVar1 = local_58;
    local_50 = puVar16 + uVar11;
    puVar16[-1] = 0x136089;
    memcpy(puVar16 + uVar11,puVar15,sVar1);
    puVar5 = os;
    puVar15 = local_50;
    uVar4 = local_60;
    local_48 = puVar16;
    puVar16[-1] = 0x1360a4;
    Hacl_Bignum_Montgomery_bn_from_mont_u64((uint32_t)puVar5,puVar16,uVar4,puVar15,puVar18);
    uVar13 = (uint32_t)os;
    if ((int)local_68 == 0) {
      puVar15 = (uint64_t *)0x0;
    }
    else {
      local_50 = (uint64_t *)0x0;
      do {
        local_58 = uVar20;
        uVar8 = ~(uint)uVar20 + (int)local_68;
        puVar15 = (uint64_t *)(ulong)((b[uVar8 >> 6] >> ((ulong)uVar8 & 0x3f) & 1) != 0);
        if (uVar13 != 0) {
          uVar20 = 0;
          do {
            uVar10 = puVar12[uVar20];
            uVar14 = (uVar10 ^ puVar18[uVar20]) & -((ulong)local_50 ^ (ulong)puVar15);
            puVar18[uVar20] = puVar18[uVar20] ^ uVar14;
            puVar12[uVar20] = uVar14 ^ uVar10;
            uVar20 = uVar20 + 1;
          } while (uVar11 != uVar20);
        }
        puVar18 = local_40;
        puVar5 = local_48;
        uVar4 = local_60;
        local_50 = puVar15;
        puVar16[-1] = 0x136133;
        bn_almost_mont_mul_u64(uVar13,puVar5,uVar4,puVar12,puVar18,puVar12);
        puVar18 = local_40;
        puVar16[-1] = 0x13614b;
        bn_almost_mont_sqr_u64(uVar13,puVar5,uVar4,puVar18,puVar18);
        uVar8 = (int)local_58 + 1;
        uVar20 = (ulong)uVar8;
        puVar15 = local_50;
      } while (uVar8 != (uint)local_68);
    }
    if (uVar13 != 0) {
      uVar20 = 0;
      do {
        uVar10 = puVar12[uVar20];
        uVar14 = (uVar10 ^ puVar18[uVar20]) & -(long)puVar15;
        puVar18[uVar20] = puVar18[uVar20] ^ uVar14;
        puVar12[uVar20] = uVar14 ^ uVar10;
        uVar20 = uVar20 + 1;
      } while (uVar11 != uVar20);
    }
  }
  else {
    local_7c = (uint)local_68 - 1 >> 6;
    local_70 = (ulong)(uVar13 * 2);
    sVar1 = local_70 * 8;
    puVar18 = puVar18 + -local_70;
    local_50 = puVar18;
    puVar18[-1] = 0x13619e;
    memset(puVar18,0,sVar1);
    __n = local_58;
    puVar15 = local_c0;
    puVar18[-1] = 0x1361b4;
    memcpy(puVar18,puVar15,__n);
    puVar15 = local_48;
    local_f8 = puVar18 + uVar11;
    puVar18[-1] = 0x1361d5;
    memcpy(puVar18 + uVar11,puVar15,__n);
    local_a0 = (uint64_t *)(ulong)(uVar13 << 4);
    sVar1 = (long)local_a0 * 8;
    puVar16 = puVar18 + -(long)local_a0;
    local_48 = puVar16;
    puVar16[-1] = 0x1361fe;
    memset(puVar16,0,sVar1);
    puVar16 = (uint64_t *)((long)puVar16 - local_a8);
    puVar16[-1] = 0x136218;
    memset(puVar16,0,__n);
    puVar19 = local_48;
    puVar5 = local_50;
    uVar4 = local_60;
    puVar15 = local_f8;
    puVar18 = local_48 + uVar11;
    puVar16[-1] = 0x136237;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(uVar13,puVar5,uVar4,puVar15,puVar19);
    sVar1 = local_58;
    puVar16[-1] = 0x136246;
    memcpy(puVar18,puVar12,sVar1);
    puVar15 = local_50;
    uVar4 = local_60;
    local_108 = puVar18;
    puVar16[-1] = 0x136266;
    bn_almost_mont_sqr_u64(uVar13,puVar15,uVar4,puVar18,puVar16);
    sVar1 = local_58;
    puVar18 = local_48 + local_70;
    puVar16[-1] = 0x136281;
    memcpy(puVar18,puVar16,sVar1);
    puVar5 = os;
    puVar15 = local_50;
    puVar16[-1] = 0x13629a;
    bn_almost_mont_mul_u64((uint32_t)puVar5,puVar15,uVar4,puVar12,puVar18,puVar16);
    sVar1 = local_58;
    uVar13 = (uint32_t)os;
    local_98 = (uint64_t *)(ulong)(uVar13 * 3);
    puVar15 = local_48 + (long)local_98;
    local_d8 = puVar15;
    puVar16[-1] = 0x1362c4;
    memcpy(puVar15,puVar16,sVar1);
    puVar15 = local_50;
    uVar4 = local_60;
    local_100 = puVar18;
    puVar16[-1] = 0x1362e1;
    bn_almost_mont_sqr_u64(uVar13,puVar15,uVar4,puVar18,puVar16);
    sVar1 = local_58;
    local_90 = (uint64_t *)(ulong)(uVar13 * 4);
    puVar18 = local_48 + (long)local_90;
    local_b8 = puVar18;
    puVar16[-1] = 0x13630b;
    memcpy(puVar18,puVar16,sVar1);
    puVar15 = local_50;
    uVar4 = local_60;
    puVar18 = local_b8;
    puVar16[-1] = 0x13632b;
    bn_almost_mont_mul_u64(uVar13,puVar15,uVar4,puVar12,puVar18,puVar16);
    sVar1 = local_58;
    local_78 = (uint64_t *)(ulong)(uVar13 * 5);
    puVar18 = local_48 + (long)local_78;
    local_d0 = puVar18;
    puVar16[-1] = 0x13634e;
    memcpy(puVar18,puVar16,sVar1);
    uVar4 = local_60;
    puVar18 = local_d8;
    puVar16[-1] = 0x13636a;
    bn_almost_mont_sqr_u64(uVar13,puVar15,uVar4,puVar18,puVar16);
    sVar1 = local_58;
    puVar18 = local_48 + (uint)((int)local_70 * 3);
    local_b0 = puVar18;
    puVar16[-1] = 0x13638c;
    memcpy(puVar18,puVar16,sVar1);
    puVar15 = local_50;
    puVar18 = local_b0;
    puVar16[-1] = 0x1363a8;
    bn_almost_mont_mul_u64(uVar13,puVar15,uVar4,puVar12,puVar18,puVar16);
    puVar15 = local_48;
    sVar1 = local_58;
    local_88 = (uint64_t *)(ulong)(uVar13 * 8);
    puVar18 = local_48 + uVar13 * 7;
    local_c8 = puVar18;
    puVar16[-1] = 0x1363d5;
    memcpy(puVar18,puVar16,sVar1);
    puVar5 = local_50;
    uVar4 = local_60;
    puVar18 = local_b8;
    puVar16[-1] = 0x1363ef;
    bn_almost_mont_sqr_u64(uVar13,puVar5,uVar4,puVar18,puVar16);
    sVar1 = local_58;
    puVar15 = puVar15 + (long)local_88;
    puVar16[-1] = 0x136406;
    memcpy(puVar15,puVar16,sVar1);
    puVar5 = os;
    puVar18 = local_50;
    uVar4 = local_60;
    local_88 = puVar15;
    puVar16[-1] = 0x136427;
    bn_almost_mont_mul_u64((uint32_t)puVar5,puVar18,uVar4,puVar12,puVar15,puVar16);
    sVar1 = local_58;
    uVar13 = (uint32_t)os;
    puVar18 = local_48 + uVar13 * 9;
    ctx_r2 = puVar18;
    puVar16[-1] = 0x13644b;
    memcpy(puVar18,puVar16,sVar1);
    puVar15 = local_50;
    puVar18 = local_d0;
    puVar16[-1] = 0x136464;
    bn_almost_mont_sqr_u64(uVar13,puVar15,uVar4,puVar18,puVar16);
    sVar1 = local_58;
    puVar18 = local_48 + (uint)((int)local_70 * 5);
    puVar16[-1] = 0x136482;
    memcpy(puVar18,puVar16,sVar1);
    puVar5 = os;
    puVar15 = local_50;
    uVar4 = local_60;
    local_e8 = puVar18;
    puVar16[-1] = 0x1364a6;
    bn_almost_mont_mul_u64((uint32_t)puVar5,puVar15,uVar4,puVar12,puVar18,puVar16);
    sVar1 = local_58;
    uVar13 = (uint32_t)os;
    puVar18 = local_48 + (uVar13 + (int)local_78 * 2);
    local_e0 = puVar18;
    puVar16[-1] = 0x1364ce;
    memcpy(puVar18,puVar16,sVar1);
    uVar4 = local_60;
    puVar18 = local_b0;
    puVar16[-1] = 0x1364e7;
    bn_almost_mont_sqr_u64(uVar13,puVar15,uVar4,puVar18,puVar16);
    sVar1 = local_58;
    puVar18 = local_48 + (uint)((int)local_90 * 3);
    puVar16[-1] = 0x13650b;
    memcpy(puVar18,puVar16,sVar1);
    puVar5 = os;
    puVar15 = local_50;
    uVar4 = local_60;
    local_90 = puVar18;
    puVar16[-1] = 0x13652c;
    bn_almost_mont_mul_u64((uint32_t)puVar5,puVar15,uVar4,puVar12,puVar18,puVar16);
    uVar13 = (uint32_t)os;
    puVar18 = local_48 + (uVar13 + (int)local_98 * 4);
    local_98 = puVar18;
    puVar16[-1] = 0x136556;
    memcpy(puVar18,puVar16,sVar1);
    puVar15 = local_50;
    uVar4 = local_60;
    puVar18 = local_c8;
    puVar16[-1] = 0x136570;
    bn_almost_mont_sqr_u64(uVar13,puVar15,uVar4,puVar18,puVar16);
    puVar5 = local_48;
    sVar1 = local_58;
    puVar18 = local_48 + ((int)local_a0 - (uint)local_70);
    puVar16[-1] = 0x136591;
    memcpy(puVar18,puVar16,sVar1);
    puVar19 = os;
    puVar15 = local_50;
    uVar4 = local_60;
    local_a0 = puVar18;
    puVar16[-1] = 0x1365b2;
    bn_almost_mont_mul_u64((uint32_t)puVar19,puVar15,uVar4,puVar12,puVar18,puVar16);
    sVar1 = local_58;
    iVar3 = (int)local_78;
    local_78 = puVar5 + (uint)(iVar3 * 3);
    puVar16[-1] = 0x1365d0;
    memcpy(puVar5 + (uint)(iVar3 * 3),puVar16,sVar1);
    puVar19 = os;
    puVar12 = local_40;
    puVar5 = local_48;
    puVar15 = local_50;
    uVar4 = local_60;
    uVar20 = local_a8;
    puVar18 = local_f8;
    if ((local_68 & 3) == 0) {
      puVar16[-1] = 0x136ae9;
      Hacl_Bignum_Montgomery_bn_from_mont_u64((uint32_t)puVar19,puVar15,uVar4,puVar18,puVar12);
      uVar20 = local_a8;
    }
    else {
      uVar10 = local_68 >> 6 & 0x3ffffff;
      bVar6 = (byte)local_68 & 0x3c;
      uVar8 = (uint)(b[uVar10] >> bVar6);
      if ((local_68 & 0x3c) != 0 && (uint)uVar10 < local_7c) {
        uVar8 = uVar8 | (uint)(b[uVar10 + 1] << (-bVar6 & 0x3f));
      }
      uVar10 = (ulong)(uVar8 & 0xf);
      puVar16[-1] = 0x13662f;
      memcpy(puVar12,puVar5,sVar1);
      puVar16[-1] = 0x13663c;
      uVar4 = FStar_UInt64_eq_mask(uVar10,1);
      puVar19 = os;
      if ((int)os != 0) {
        uVar14 = 0;
        do {
          local_40[uVar14] = local_40[uVar14] & ~uVar4 | local_108[uVar14] & uVar4;
          uVar14 = uVar14 + 1;
        } while (uVar11 != uVar14);
        puVar16[-1] = 0x136686;
        uVar4 = FStar_UInt64_eq_mask(uVar10,2);
        puVar19 = os;
        if ((int)os != 0) {
          uVar14 = 0;
          do {
            local_40[uVar14] = local_40[uVar14] & ~uVar4 | local_100[uVar14] & uVar4;
            uVar14 = uVar14 + 1;
          } while (uVar11 != uVar14);
          puVar16[-1] = 0x1366d0;
          uVar4 = FStar_UInt64_eq_mask(uVar10,3);
          puVar19 = os;
          if ((int)os != 0) {
            uVar14 = 0;
            do {
              local_40[uVar14] = local_40[uVar14] & ~uVar4 | local_d8[uVar14] & uVar4;
              uVar14 = uVar14 + 1;
            } while (uVar11 != uVar14);
            puVar16[-1] = 0x13671a;
            uVar4 = FStar_UInt64_eq_mask(uVar10,4);
            puVar19 = os;
            if ((int)os != 0) {
              uVar14 = 0;
              do {
                local_40[uVar14] = local_40[uVar14] & ~uVar4 | local_b8[uVar14] & uVar4;
                uVar14 = uVar14 + 1;
              } while (uVar11 != uVar14);
              puVar16[-1] = 0x136764;
              uVar4 = FStar_UInt64_eq_mask(uVar10,5);
              puVar19 = os;
              if ((int)os != 0) {
                uVar14 = 0;
                do {
                  local_40[uVar14] = local_40[uVar14] & ~uVar4 | local_d0[uVar14] & uVar4;
                  uVar14 = uVar14 + 1;
                } while (uVar11 != uVar14);
                puVar16[-1] = 0x1367ae;
                uVar4 = FStar_UInt64_eq_mask(uVar10,6);
                puVar19 = os;
                if ((int)os != 0) {
                  uVar14 = 0;
                  do {
                    local_40[uVar14] = local_40[uVar14] & ~uVar4 | local_b0[uVar14] & uVar4;
                    uVar14 = uVar14 + 1;
                  } while (uVar11 != uVar14);
                  puVar16[-1] = 0x1367f8;
                  uVar4 = FStar_UInt64_eq_mask(uVar10,7);
                  puVar19 = os;
                  if ((int)os != 0) {
                    uVar14 = 0;
                    do {
                      local_40[uVar14] = local_40[uVar14] & ~uVar4 | local_c8[uVar14] & uVar4;
                      uVar14 = uVar14 + 1;
                    } while (uVar11 != uVar14);
                    puVar16[-1] = 0x136842;
                    uVar4 = FStar_UInt64_eq_mask(uVar10,8);
                    puVar19 = os;
                    if ((int)os != 0) {
                      uVar14 = 0;
                      do {
                        local_40[uVar14] = local_40[uVar14] & ~uVar4 | local_88[uVar14] & uVar4;
                        uVar14 = uVar14 + 1;
                      } while (uVar11 != uVar14);
                      puVar16[-1] = 0x136889;
                      uVar4 = FStar_UInt64_eq_mask(uVar10,9);
                      puVar19 = os;
                      if ((int)os != 0) {
                        uVar14 = 0;
                        do {
                          local_40[uVar14] = local_40[uVar14] & ~uVar4 | ctx_r2[uVar14] & uVar4;
                          uVar14 = uVar14 + 1;
                        } while (uVar11 != uVar14);
                        puVar16[-1] = 0x1368d3;
                        uVar4 = FStar_UInt64_eq_mask(uVar10,10);
                        puVar19 = os;
                        if ((int)os != 0) {
                          uVar14 = 0;
                          do {
                            local_40[uVar14] = local_40[uVar14] & ~uVar4 | local_e8[uVar14] & uVar4;
                            uVar14 = uVar14 + 1;
                          } while (uVar11 != uVar14);
                          puVar16[-1] = 0x13691d;
                          uVar4 = FStar_UInt64_eq_mask(uVar10,0xb);
                          puVar19 = os;
                          if ((int)os != 0) {
                            uVar14 = 0;
                            do {
                              local_40[uVar14] =
                                   local_40[uVar14] & ~uVar4 | local_e0[uVar14] & uVar4;
                              uVar14 = uVar14 + 1;
                            } while (uVar11 != uVar14);
                            puVar16[-1] = 0x136967;
                            uVar4 = FStar_UInt64_eq_mask(uVar10,0xc);
                            puVar19 = os;
                            if ((int)os != 0) {
                              uVar14 = 0;
                              do {
                                local_40[uVar14] =
                                     local_40[uVar14] & ~uVar4 | local_90[uVar14] & uVar4;
                                uVar14 = uVar14 + 1;
                              } while (uVar11 != uVar14);
                              puVar16[-1] = 0x1369b1;
                              uVar4 = FStar_UInt64_eq_mask(uVar10,0xd);
                              puVar19 = os;
                              if ((int)os != 0) {
                                uVar14 = 0;
                                do {
                                  local_40[uVar14] =
                                       local_40[uVar14] & ~uVar4 | local_98[uVar14] & uVar4;
                                  uVar14 = uVar14 + 1;
                                } while (uVar11 != uVar14);
                                puVar16[-1] = 0x1369fb;
                                uVar4 = FStar_UInt64_eq_mask(uVar10,0xe);
                                puVar19 = os;
                                if ((int)os != 0) {
                                  uVar14 = 0;
                                  do {
                                    local_40[uVar14] =
                                         local_40[uVar14] & ~uVar4 | local_a0[uVar14] & uVar4;
                                    uVar14 = uVar14 + 1;
                                  } while (uVar11 != uVar14);
                                  puVar16[-1] = 0x136a45;
                                  uVar4 = FStar_UInt64_eq_mask(uVar10,0xf);
                                  puVar19 = os;
                                  if ((int)os != 0) {
                                    uVar10 = 0;
                                    do {
                                      local_40[uVar10] =
                                           local_40[uVar10] & ~uVar4 | local_78[uVar10] & uVar4;
                                      uVar10 = uVar10 + 1;
                                    } while (uVar11 != uVar10);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    puVar18 = local_40;
    puVar16 = (uint64_t *)((long)puVar16 - uVar20);
    uVar20 = local_68 >> 2;
    local_68 = (ulong)((uint)local_68 & 0xfffffffc);
    local_70 = CONCAT44(local_70._4_4_,
                        ((uint)uVar20 & 0x3fffffff) + (uint)((uVar20 & 0x3fffffff) == 0));
    puVar5 = (uint64_t *)0x0;
    local_110 = uVar11;
    do {
      uVar4 = local_60;
      uVar13 = (uint32_t)puVar19;
      local_40 = puVar5;
      puVar16[-1] = 0x136b3b;
      bn_almost_mont_sqr_u64(uVar13,puVar15,uVar4,puVar18,puVar18);
      puVar16[-1] = 0x136b4f;
      bn_almost_mont_sqr_u64(uVar13,puVar15,uVar4,puVar18,puVar18);
      puVar16[-1] = 0x136b63;
      bn_almost_mont_sqr_u64(uVar13,puVar15,uVar4,puVar18,puVar18);
      puVar16[-1] = 0x136b77;
      bn_almost_mont_sqr_u64(uVar13,puVar15,uVar4,puVar18,puVar18);
      puVar15 = local_48;
      sVar1 = local_58;
      uVar9 = ((int)local_68 + (int)local_40 * -4) - 4;
      uVar8 = uVar9 >> 6;
      uVar9 = uVar9 & 0x3c;
      sVar7 = (sbyte)uVar9;
      uVar17 = (uint)(b[uVar8] >> sVar7);
      if (uVar9 != 0 && uVar8 < local_7c) {
        uVar17 = uVar17 | (uint)(b[(ulong)uVar8 + 1] << (-sVar7 & 0x3fU));
      }
      uVar11 = (ulong)(uVar17 & 0xf);
      puVar16[-1] = 0x136bd0;
      memcpy(puVar16,puVar15,sVar1);
      puVar16[-1] = 0x136bdd;
      uVar4 = FStar_UInt64_eq_mask(uVar11,1);
      puVar15 = local_108;
      uVar20 = local_110;
      uVar13 = (uint32_t)os;
      if (uVar13 != 0) {
        uVar10 = 0;
        do {
          puVar16[uVar10] = puVar16[uVar10] & ~uVar4 | puVar15[uVar10] & uVar4;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
        puVar16[-1] = 0x136c29;
        uVar4 = FStar_UInt64_eq_mask(uVar11,2);
        puVar15 = local_100;
        uVar13 = (uint32_t)os;
        if (uVar13 != 0) {
          uVar10 = 0;
          do {
            puVar16[uVar10] = puVar16[uVar10] & ~uVar4 | puVar15[uVar10] & uVar4;
            uVar10 = uVar10 + 1;
          } while (uVar20 != uVar10);
          puVar16[-1] = 0x136c6e;
          uVar4 = FStar_UInt64_eq_mask(uVar11,3);
          puVar15 = local_d8;
          uVar13 = (uint32_t)os;
          if (uVar13 != 0) {
            uVar10 = 0;
            do {
              puVar16[uVar10] = puVar16[uVar10] & ~uVar4 | puVar15[uVar10] & uVar4;
              uVar10 = uVar10 + 1;
            } while (uVar20 != uVar10);
            puVar16[-1] = 0x136cb3;
            uVar4 = FStar_UInt64_eq_mask(uVar11,4);
            puVar15 = local_b8;
            uVar13 = (uint32_t)os;
            if (uVar13 != 0) {
              uVar10 = 0;
              do {
                puVar16[uVar10] = puVar16[uVar10] & ~uVar4 | puVar15[uVar10] & uVar4;
                uVar10 = uVar10 + 1;
              } while (uVar20 != uVar10);
              puVar16[-1] = 0x136cf8;
              uVar4 = FStar_UInt64_eq_mask(uVar11,5);
              puVar15 = local_d0;
              uVar13 = (uint32_t)os;
              if (uVar13 != 0) {
                uVar10 = 0;
                do {
                  puVar16[uVar10] = puVar16[uVar10] & ~uVar4 | puVar15[uVar10] & uVar4;
                  uVar10 = uVar10 + 1;
                } while (uVar20 != uVar10);
                puVar16[-1] = 0x136d3d;
                uVar4 = FStar_UInt64_eq_mask(uVar11,6);
                puVar15 = local_b0;
                uVar13 = (uint32_t)os;
                if (uVar13 != 0) {
                  uVar10 = 0;
                  do {
                    puVar16[uVar10] = puVar16[uVar10] & ~uVar4 | puVar15[uVar10] & uVar4;
                    uVar10 = uVar10 + 1;
                  } while (uVar20 != uVar10);
                  puVar16[-1] = 0x136d82;
                  uVar4 = FStar_UInt64_eq_mask(uVar11,7);
                  puVar15 = local_c8;
                  uVar13 = (uint32_t)os;
                  if (uVar13 != 0) {
                    uVar10 = 0;
                    do {
                      puVar16[uVar10] = puVar16[uVar10] & ~uVar4 | puVar15[uVar10] & uVar4;
                      uVar10 = uVar10 + 1;
                    } while (uVar20 != uVar10);
                    puVar16[-1] = 0x136dc7;
                    uVar4 = FStar_UInt64_eq_mask(uVar11,8);
                    puVar15 = local_88;
                    uVar13 = (uint32_t)os;
                    if (uVar13 != 0) {
                      uVar10 = 0;
                      do {
                        puVar16[uVar10] = puVar16[uVar10] & ~uVar4 | puVar15[uVar10] & uVar4;
                        uVar10 = uVar10 + 1;
                      } while (uVar20 != uVar10);
                      puVar16[-1] = 0x136e09;
                      uVar4 = FStar_UInt64_eq_mask(uVar11,9);
                      puVar15 = ctx_r2;
                      uVar13 = (uint32_t)os;
                      if (uVar13 != 0) {
                        uVar10 = 0;
                        do {
                          puVar16[uVar10] = puVar16[uVar10] & ~uVar4 | puVar15[uVar10] & uVar4;
                          uVar10 = uVar10 + 1;
                        } while (uVar20 != uVar10);
                        puVar16[-1] = 0x136e4e;
                        uVar4 = FStar_UInt64_eq_mask(uVar11,10);
                        puVar15 = local_e8;
                        uVar13 = (uint32_t)os;
                        if (uVar13 != 0) {
                          uVar10 = 0;
                          do {
                            puVar16[uVar10] = puVar16[uVar10] & ~uVar4 | puVar15[uVar10] & uVar4;
                            uVar10 = uVar10 + 1;
                          } while (uVar20 != uVar10);
                          puVar16[-1] = 0x136e93;
                          uVar4 = FStar_UInt64_eq_mask(uVar11,0xb);
                          puVar15 = local_e0;
                          uVar13 = (uint32_t)os;
                          if (uVar13 != 0) {
                            uVar10 = 0;
                            do {
                              puVar16[uVar10] = puVar16[uVar10] & ~uVar4 | puVar15[uVar10] & uVar4;
                              uVar10 = uVar10 + 1;
                            } while (uVar20 != uVar10);
                            puVar16[-1] = 0x136ed8;
                            uVar4 = FStar_UInt64_eq_mask(uVar11,0xc);
                            puVar15 = local_90;
                            uVar13 = (uint32_t)os;
                            if (uVar13 != 0) {
                              uVar10 = 0;
                              do {
                                puVar16[uVar10] = puVar16[uVar10] & ~uVar4 | puVar15[uVar10] & uVar4
                                ;
                                uVar10 = uVar10 + 1;
                              } while (uVar20 != uVar10);
                              puVar16[-1] = 0x136f1d;
                              uVar4 = FStar_UInt64_eq_mask(uVar11,0xd);
                              puVar15 = local_98;
                              uVar13 = (uint32_t)os;
                              if (uVar13 != 0) {
                                uVar10 = 0;
                                do {
                                  puVar16[uVar10] =
                                       puVar16[uVar10] & ~uVar4 | puVar15[uVar10] & uVar4;
                                  uVar10 = uVar10 + 1;
                                } while (uVar20 != uVar10);
                                puVar16[-1] = 0x136f62;
                                uVar4 = FStar_UInt64_eq_mask(uVar11,0xe);
                                puVar15 = local_a0;
                                uVar13 = (uint32_t)os;
                                if (uVar13 != 0) {
                                  uVar10 = 0;
                                  do {
                                    puVar16[uVar10] =
                                         puVar16[uVar10] & ~uVar4 | puVar15[uVar10] & uVar4;
                                    uVar10 = uVar10 + 1;
                                  } while (uVar20 != uVar10);
                                  puVar16[-1] = 0x136fa3;
                                  uVar4 = FStar_UInt64_eq_mask(uVar11,0xf);
                                  uVar13 = (uint32_t)os;
                                  if (uVar13 != 0) {
                                    uVar11 = 0;
                                    do {
                                      puVar16[uVar11] =
                                           puVar16[uVar11] & ~uVar4 | local_78[uVar11] & uVar4;
                                      uVar11 = uVar11 + 1;
                                    } while (uVar20 != uVar11);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      puVar15 = local_50;
      uVar4 = local_60;
      puVar16[-1] = 0x136fed;
      bn_almost_mont_mul_u64(uVar13,puVar15,uVar4,puVar18,puVar16,puVar18);
      uVar13 = (uint32_t)os;
      uVar8 = (int)local_40 + 1;
      puVar5 = (uint64_t *)(ulong)uVar8;
      puVar19 = os;
    } while (uVar8 != (uint)local_70);
  }
  uVar4 = local_60;
  puVar15 = local_c0;
  puVar16[-1] = 0x13701a;
  Hacl_Bignum_Montgomery_bn_from_mont_u64(uVar13,puVar15,uVar4,puVar18,res);
  return;
}

Assistant:

void
Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64(
  uint32_t len,
  uint64_t *n,
  uint64_t mu,
  uint64_t *r2,
  uint64_t *a,
  uint32_t bBits,
  uint64_t *b,
  uint64_t *res
)
{
  if (bBits < 200U)
  {
    KRML_CHECK_SIZE(sizeof (uint64_t), len);
    uint64_t aM[len];
    memset(aM, 0U, len * sizeof (uint64_t));
    Hacl_Bignum_Montgomery_bn_to_mont_u64(len, n, mu, r2, a, aM);
    KRML_CHECK_SIZE(sizeof (uint64_t), len);
    uint64_t resM[len];
    memset(resM, 0U, len * sizeof (uint64_t));
    KRML_CHECK_SIZE(sizeof (uint64_t), len + len);
    uint64_t ctx[len + len];
    memset(ctx, 0U, (len + len) * sizeof (uint64_t));
    memcpy(ctx, n, len * sizeof (uint64_t));
    memcpy(ctx + len, r2, len * sizeof (uint64_t));
    uint64_t sw = 0ULL;
    uint64_t *ctx_n = ctx;
    uint64_t *ctx_r2 = ctx + len;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(len, ctx_n, mu, ctx_r2, resM);
    for (uint32_t i0 = 0U; i0 < bBits; i0++)
    {
      uint32_t i1 = (bBits - i0 - 1U) / 64U;
      uint32_t j = (bBits - i0 - 1U) % 64U;
      uint64_t tmp = b[i1];
      uint64_t bit = tmp >> j & 1ULL;
      uint64_t sw1 = bit ^ sw;
      for (uint32_t i = 0U; i < len; i++)
      {
        uint64_t dummy = (0ULL - sw1) & (resM[i] ^ aM[i]);
        resM[i] = resM[i] ^ dummy;
        aM[i] = aM[i] ^ dummy;
      }
      uint64_t *ctx_n0 = ctx;
      bn_almost_mont_mul_u64(len, ctx_n0, mu, aM, resM, aM);
      uint64_t *ctx_n1 = ctx;
      bn_almost_mont_sqr_u64(len, ctx_n1, mu, resM, resM);
      sw = bit;
    }
    uint64_t sw0 = sw;
    for (uint32_t i = 0U; i < len; i++)
    {
      uint64_t dummy = (0ULL - sw0) & (resM[i] ^ aM[i]);
      resM[i] = resM[i] ^ dummy;
      aM[i] = aM[i] ^ dummy;
    }
    Hacl_Bignum_Montgomery_bn_from_mont_u64(len, n, mu, resM, res);
    return;
  }
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t aM[len];
  memset(aM, 0U, len * sizeof (uint64_t));
  Hacl_Bignum_Montgomery_bn_to_mont_u64(len, n, mu, r2, a, aM);
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t resM[len];
  memset(resM, 0U, len * sizeof (uint64_t));
  uint32_t bLen;
  if (bBits == 0U)
  {
    bLen = 1U;
  }
  else
  {
    bLen = (bBits - 1U) / 64U + 1U;
  }
  KRML_CHECK_SIZE(sizeof (uint64_t), len + len);
  uint64_t ctx[len + len];
  memset(ctx, 0U, (len + len) * sizeof (uint64_t));
  memcpy(ctx, n, len * sizeof (uint64_t));
  memcpy(ctx + len, r2, len * sizeof (uint64_t));
  KRML_CHECK_SIZE(sizeof (uint64_t), 16U * len);
  uint64_t table[16U * len];
  memset(table, 0U, 16U * len * sizeof (uint64_t));
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t tmp[len];
  memset(tmp, 0U, len * sizeof (uint64_t));
  uint64_t *t0 = table;
  uint64_t *t1 = table + len;
  uint64_t *ctx_n0 = ctx;
  uint64_t *ctx_r20 = ctx + len;
  Hacl_Bignum_Montgomery_bn_from_mont_u64(len, ctx_n0, mu, ctx_r20, t0);
  memcpy(t1, aM, len * sizeof (uint64_t));
  KRML_MAYBE_FOR7(i,
    0U,
    7U,
    1U,
    uint64_t *t11 = table + (i + 1U) * len;
    uint64_t *ctx_n1 = ctx;
    bn_almost_mont_sqr_u64(len, ctx_n1, mu, t11, tmp);
    memcpy(table + (2U * i + 2U) * len, tmp, len * sizeof (uint64_t));
    uint64_t *t2 = table + (2U * i + 2U) * len;
    uint64_t *ctx_n = ctx;
    bn_almost_mont_mul_u64(len, ctx_n, mu, aM, t2, tmp);
    memcpy(table + (2U * i + 3U) * len, tmp, len * sizeof (uint64_t)););
  if (bBits % 4U != 0U)
  {
    uint32_t i0 = bBits / 4U * 4U;
    uint64_t bits_c = Hacl_Bignum_Lib_bn_get_bits_u64(bLen, b, i0, 4U);
    memcpy(resM, (uint64_t *)(table + 0U * len), len * sizeof (uint64_t));
    KRML_MAYBE_FOR15(i1,
      0U,
      15U,
      1U,
      uint64_t c = FStar_UInt64_eq_mask(bits_c, (uint64_t)(i1 + 1U));
      const uint64_t *res_j = table + (i1 + 1U) * len;
      for (uint32_t i = 0U; i < len; i++)
      {
        uint64_t *os = resM;
        uint64_t x = (c & res_j[i]) | (~c & resM[i]);
        os[i] = x;
      });
  }
  else
  {
    uint64_t *ctx_n = ctx;
    uint64_t *ctx_r2 = ctx + len;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(len, ctx_n, mu, ctx_r2, resM);
  }
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t tmp0[len];
  memset(tmp0, 0U, len * sizeof (uint64_t));
  for (uint32_t i0 = 0U; i0 < bBits / 4U; i0++)
  {
    KRML_MAYBE_FOR4(i,
      0U,
      4U,
      1U,
      uint64_t *ctx_n = ctx;
      bn_almost_mont_sqr_u64(len, ctx_n, mu, resM, resM););
    uint32_t k = bBits - bBits % 4U - 4U * i0 - 4U;
    uint64_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u64(bLen, b, k, 4U);
    memcpy(tmp0, (uint64_t *)(table + 0U * len), len * sizeof (uint64_t));
    KRML_MAYBE_FOR15(i1,
      0U,
      15U,
      1U,
      uint64_t c = FStar_UInt64_eq_mask(bits_l, (uint64_t)(i1 + 1U));
      const uint64_t *res_j = table + (i1 + 1U) * len;
      for (uint32_t i = 0U; i < len; i++)
      {
        uint64_t *os = tmp0;
        uint64_t x = (c & res_j[i]) | (~c & tmp0[i]);
        os[i] = x;
      });
    uint64_t *ctx_n = ctx;
    bn_almost_mont_mul_u64(len, ctx_n, mu, resM, tmp0, resM);
  }
  Hacl_Bignum_Montgomery_bn_from_mont_u64(len, n, mu, resM, res);
}